

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O1

bool CivetServer::getParam(mg_connection *conn,char *name,string *dst,size_t occurrence)

{
  void *pvVar1;
  iterator __position;
  char *__s;
  char *pcVar2;
  char *__s_00;
  bool bVar3;
  uint uVar4;
  mg_request_info *pmVar5;
  vector<char,std::allocator<char>> *this;
  size_t sVar6;
  long lVar7;
  char buf [2048];
  value_type local_849;
  mg_connection *local_848;
  size_t local_840;
  undefined1 local_838 [2056];
  
  local_848 = conn;
  local_840 = occurrence;
  pmVar5 = mg_get_request_info(conn);
  pvVar1 = pmVar5->user_data;
  mg_lock_context(*(mg_context **)((long)pvVar1 + 8));
  this = (vector<char,std::allocator<char>> *)
         std::
         map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
         ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                       *)((long)pvVar1 + 0x10),&local_848);
  mg_unlock_context(*(mg_context **)((long)pvVar1 + 8));
  mg_lock_connection(local_848);
  if (*(long *)this == *(long *)(this + 8)) {
    uVar4 = mg_read(local_848,local_838,0x800);
    if (uVar4 != 0) {
      do {
        if ((int)uVar4 < 0) {
LAB_0010ae31:
          local_849 = '\0';
          std::vector<char,_std::allocator<char>_>::_M_fill_assign
                    ((vector<char,_std::allocator<char>_> *)this,1,&local_849);
          goto LAB_0010ae55;
        }
        lVar7 = *(long *)(this + 8) - *(long *)this;
        if (0x200000 < lVar7 + (ulong)uVar4) goto LAB_0010ae31;
        std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                  (this,*(long *)this + lVar7,local_838,local_838 + uVar4);
        uVar4 = mg_read(local_848,local_838,0x800);
      } while (uVar4 != 0);
    }
    local_849 = '\0';
    __position._M_current = *(char **)(this + 8);
    if (__position._M_current == *(char **)(this + 0x10)) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                ((vector<char,_std::allocator<char>_> *)this,__position,&local_849);
    }
    else {
      *__position._M_current = '\0';
      *(long *)(this + 8) = *(long *)(this + 8) + 1;
    }
  }
LAB_0010ae55:
  __s = *(char **)this;
  pcVar2 = *(char **)(this + 8);
  __s_00 = pmVar5->query_string;
  mg_unlock_connection(local_848);
  bVar3 = false;
  if ((__s != (char *)0x0) && (bVar3 = false, __s != pcVar2)) {
    sVar6 = strlen(__s);
    bVar3 = getParam(__s,sVar6,name,dst,local_840);
  }
  if ((__s_00 != (char *)0x0) && (bVar3 == false)) {
    sVar6 = strlen(__s_00);
    bVar3 = getParam(__s_00,sVar6,name,dst,local_840);
  }
  return bVar3;
}

Assistant:

bool
CivetServer::getParam(struct mg_connection *conn,
                      const char *name,
                      std::string &dst,
                      size_t occurrence)
{
	const char *formParams = NULL;
	const char *queryString = NULL;
	const struct mg_request_info *ri = mg_get_request_info(conn);
	assert(ri != NULL);
	CivetServer *me = (CivetServer *)(ri->user_data);
	assert(me != NULL);
	mg_lock_context(me->context);
	CivetConnection &conobj = me->connections[conn];
	mg_unlock_context(me->context);

	mg_lock_connection(conn);
	if (conobj.postData.empty()) {
		// check if there is a request body
		for (;;) {
			char buf[2048];
			int r = mg_read(conn, buf, sizeof(buf));
			try {
				if (r == 0) {
					conobj.postData.push_back('\0');
					break;
				} else if ((r < 0)
				           || ((conobj.postData.size() + r)
				               > MAX_PARAM_BODY_LENGTH)) {
					conobj.postData.assign(1, '\0');
					break;
				}
				conobj.postData.insert(conobj.postData.end(), buf, buf + r);
			} catch (...) {
				conobj.postData.clear();
				break;
			}
		}
	}
	if (!conobj.postData.empty()) {
		// check if form parameter are already stored
		formParams = &conobj.postData[0];
	}

	if (ri->query_string != NULL) {
		// get requests do store html <form> field values in the http
		// query_string
		queryString = ri->query_string;
	}

	mg_unlock_connection(conn);

	bool get_param_success = false;
	if (formParams != NULL) {
		get_param_success =
		    getParam(formParams, strlen(formParams), name, dst, occurrence);
	}
	if (!get_param_success && queryString != NULL) {
		get_param_success =
		    getParam(queryString, strlen(queryString), name, dst, occurrence);
	}

	return get_param_success;
}